

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O1

ssize_t __thiscall http::Request::send(Request *this,int __fd,void *__buf,size_t __n,int __flags)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *__nptr;
  _Alloc_hider _Var3;
  size_type sVar4;
  char cVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  ssize_t sVar10;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var11;
  uchar *extraout_RAX;
  size_type sVar12;
  int *piVar13;
  long lVar14;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var15;
  runtime_error *this_00;
  RequestError *this_01;
  system_error *this_02;
  error_category *__ecat;
  socklen_t __len;
  size_type *psVar16;
  pointer pbVar17;
  void *pvVar18;
  uchar *puVar19;
  uchar *puVar20;
  char cVar21;
  undefined4 in_register_00000034;
  InternetProtocol *pIVar22;
  pointer pbVar23;
  undefined8 uVar24;
  undefined4 in_register_00000084;
  pointer pbVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  void *__buf_00;
  ulong uVar29;
  ulong uVar30;
  uchar *puVar31;
  bool bVar32;
  uint8_t crlf [2];
  string line;
  vector<unsigned_char,_std::allocator<unsigned_char>_> responseData;
  Socket socket;
  Response *response;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string headerValue;
  string __str_1;
  string headerData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> requestData;
  addrinfo *info;
  addrinfo hints;
  uint8_t tempBuffer [4096];
  undefined2 local_11ba;
  value_type local_11b8;
  uchar *local_1198;
  uchar *puStack_1190;
  undefined8 local_1188;
  Socket local_117c;
  Request *local_1178;
  uint local_116c;
  undefined1 local_1168 [24];
  long lStack_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138;
  addrinfo *local_1118;
  InternetProtocol *local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1108;
  ulong local_10e8;
  long *local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  ulong local_10c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10c0;
  long local_10b8;
  long local_10b0;
  long lStack_10a8;
  string *local_10a0;
  undefined1 *local_1098;
  void *local_1090;
  long local_1088;
  addrinfo *local_1078;
  char *local_1070;
  addrinfo local_1068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038 [128];
  
  pIVar22 = (InternetProtocol *)CONCAT44(in_register_00000034,__fd);
  local_1178 = this;
  local_10e0 = (long *)__n;
  iVar6 = std::__cxx11::string::compare((char *)(pIVar22 + 8));
  if (iVar6 != 0) goto LAB_001503be;
  local_1068.ai_canonname = (char *)0x0;
  local_1068.ai_next = (addrinfo *)0x0;
  local_1068.ai_addrlen = 0;
  local_1068._20_4_ = 0;
  local_1068.ai_addr = (sockaddr *)0x0;
  local_1068.ai_flags = 0;
  local_1068.ai_family = 0;
  local_1068.ai_socktype = 0;
  local_1068.ai_protocol = 0;
  iVar6 = detail::getAddressFamily(*pIVar22);
  local_1068.ai_family = iVar6;
  local_1068.ai_socktype = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(pIVar22 + 0x28);
  iVar6 = getaddrinfo(*(char **)(pIVar22 + 0x28),*(char **)(pIVar22 + 0x48),&local_1068,&local_1078)
  ;
  if (iVar6 != 0) {
    this_02 = (system_error *)__cxa_allocate_exception(0x20);
    piVar13 = __errno_location();
    iVar6 = *piVar13;
    std::operator+(local_1038,"Failed to get address info of ",__rhs);
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_02,iVar6,__ecat,local_1038);
    __cxa_throw(this_02,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  local_1118 = local_1078;
  local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_11b8,*__buf,*(long *)((long)__buf + 8) + *__buf);
  std::__cxx11::string::append((char *)&local_11b8);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_11b8,*(undefined8 *)(pIVar22 + 0x68));
  paVar1 = &local_1038[0].field_2;
  psVar16 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_1038[0].field_2._0_8_ = *psVar16;
    local_1038[0].field_2._8_8_ = plVar7[3];
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1038[0].field_2._0_8_ = *psVar16;
    local_1038[0]._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1038[0]._M_string_length = plVar7[1];
  *plVar7 = (long)psVar16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_1038);
  local_10c0._M_current = (char *)&local_10b0;
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_10b0 = *plVar8;
    lStack_10a8 = plVar7[3];
  }
  else {
    local_10b0 = *plVar8;
    local_10c0._M_current = (char *)*plVar7;
  }
  local_10b8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  local_1140 = __rhs;
  local_1110 = pIVar22;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
    operator_delete(local_11b8._M_dataplus._M_p);
  }
  plVar7 = *(long **)CONCAT44(in_register_00000084,__flags);
  plVar8 = (long *)((long *)CONCAT44(in_register_00000084,__flags))[1];
  if (plVar7 != plVar8) {
    do {
      local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)local_1038,*plVar7,plVar7[1] + *plVar7);
      std::__cxx11::string::append((char *)local_1038);
      std::__cxx11::string::_M_append((char *)&local_10c0,(ulong)local_1038[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1038[0]._M_dataplus._M_p);
      }
      plVar7 = plVar7 + 4;
    } while (plVar7 != plVar8);
  }
  std::operator+(&local_1138,"Host: ",local_1140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1138);
  plVar7 = local_10e0;
  local_1168._0_8_ = local_1168 + 0x10;
  pbVar17 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar17) {
    local_1168._16_8_ = (pbVar17->_M_dataplus)._M_p;
    lStack_1150 = plVar8[3];
  }
  else {
    local_1168._16_8_ = (pbVar17->_M_dataplus)._M_p;
    local_1168._0_8_ = (pointer)*plVar8;
  }
  local_1168._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar29 = local_10e0[1] - *local_10e0;
  cVar21 = '\x01';
  if (9 < uVar29) {
    uVar30 = uVar29;
    cVar5 = '\x04';
    do {
      cVar21 = cVar5;
      if (uVar30 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_0014f885;
      }
      if (uVar30 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_0014f885;
      }
      if (uVar30 < 10000) goto LAB_0014f885;
      bVar27 = 99999 < uVar30;
      uVar30 = uVar30 / 10000;
      cVar5 = cVar21 + '\x04';
    } while (bVar27);
    cVar21 = cVar21 + '\x01';
  }
LAB_0014f885:
  local_1108._M_dataplus._M_p = (pointer)&local_1108.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1108,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_1108._M_dataplus._M_p,(uint)local_1108._M_string_length,uVar29);
  pbVar17 = (pointer)((long)&((_Alloc_hider *)local_1168._8_8_)->_M_p +
                     CONCAT44(local_1108._M_string_length._4_4_,(uint)local_1108._M_string_length));
  pbVar23 = (pointer)0xf;
  if ((pointer)local_1168._0_8_ != (pointer)(local_1168 + 0x10)) {
    pbVar23 = (pointer)local_1168._16_8_;
  }
  pbVar25 = (pointer)local_1168._8_8_;
  if (pbVar23 < pbVar17) {
    uVar24 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1108._M_dataplus._M_p != &local_1108.field_2) {
      uVar24 = local_1108.field_2._M_allocated_capacity;
    }
    if (pbVar17 <= (ulong)uVar24) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1108,0,(char *)0x0,local_1168._0_8_);
      goto LAB_0014f931;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append(local_1168,(ulong)local_1108._M_dataplus._M_p);
LAB_0014f931:
  local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
  psVar16 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_11b8.field_2._M_allocated_capacity = *psVar16;
    local_11b8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_11b8.field_2._M_allocated_capacity = *psVar16;
    local_11b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_11b8._M_string_length = puVar9[1];
  *puVar9 = psVar16;
  puVar9[1] = 0;
  *(undefined1 *)psVar16 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_11b8);
  psVar16 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_1038[0].field_2._0_8_ = *psVar16;
    local_1038[0].field_2._8_8_ = plVar8[3];
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1038[0].field_2._0_8_ = *psVar16;
    local_1038[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1038[0]._M_string_length = plVar8[1];
  *plVar8 = (long)psVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_10c0,(ulong)local_1038[0]._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
    operator_delete(local_11b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1108._M_dataplus._M_p != &local_1108.field_2) {
    operator_delete(local_1108._M_dataplus._M_p);
  }
  if ((pointer)local_1168._0_8_ != (pointer)(local_1168 + 0x10)) {
    operator_delete((void *)local_1168._0_8_);
  }
  pIVar22 = local_1110;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1090,local_10c0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_10c0._M_current + local_10b8),(allocator_type *)local_1038);
  __len = (socklen_t)plVar7[1];
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1090,local_1088,*plVar7);
  detail::Socket::Socket(&local_117c,*pIVar22);
  detail::Socket::connect
            (&local_117c,(int)local_1118->ai_addr,(sockaddr *)(ulong)local_1118->ai_addrlen,__len);
  __buf_00 = (void *)(local_1088 - (long)local_1090);
  if (__buf_00 != (void *)0x0) {
    pvVar18 = local_1090;
    do {
      sVar10 = detail::Socket::send(&local_117c,(int)pvVar18,__buf_00,0x4000,(int)pbVar25);
      pvVar18 = (void *)((long)pvVar18 + sVar10);
      __buf_00 = (void *)((long)__buf_00 - sVar10);
    } while (__buf_00 != (void *)0x0);
  }
  local_11ba = 0xa0d;
  *(int *)local_1178 = 0;
  local_10a0 = &local_1178->scheme;
  (local_1178->scheme)._M_dataplus._M_p = (pointer)0x0;
  (local_1178->scheme)._M_string_length = 0;
  (local_1178->scheme).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(local_1178->scheme).field_2 + 8) = 0;
  (local_1178->domain)._M_dataplus._M_p = (pointer)0x0;
  (local_1178->domain)._M_string_length = 0;
  local_1198 = (uchar *)0x0;
  puStack_1190 = (uchar *)0x0;
  local_1188 = 0;
  local_1140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&(local_1178->scheme).field_2._M_allocated_capacity + 1);
  local_10e0 = (long *)CONCAT44(local_10e0._4_4_,(int)CONCAT71((int7)((ulong)local_1140 >> 8),1));
  local_10e8 = 0;
  bVar28 = false;
  bVar27 = false;
  local_10d0 = 0;
  local_10d8 = 0;
  local_10c8 = 0;
  local_1110 = (InternetProtocol *)0x0;
  do {
    sVar10 = detail::Socket::recv(&local_117c,(int)local_1038,(void *)0x1000,0x4000,(int)pbVar25);
    iVar6 = 6;
    if (sVar10 == 0) goto LAB_0015029d;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1198,puStack_1190,
               local_1038);
    if (((ulong)local_1110 & 1) == 0) {
      do {
        _Var11 = std::
                 __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (local_1198,puStack_1190,&local_11ba);
        if (_Var11._M_current == puStack_1190) {
          bVar32 = false;
        }
        else {
          local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((string *)&local_11b8,local_1198,_Var11._M_current);
          puVar31 = local_1198;
          puVar19 = _Var11._M_current + 2;
          puVar20 = extraout_RAX;
          if (puVar19 != local_1198) {
            if ((long)puStack_1190 - (long)puVar19 != 0) {
              memmove(local_1198,puVar19,(long)puStack_1190 - (long)puVar19);
            }
            puVar20 = puStack_1190;
            if (puStack_1190 != puVar31 + ((long)puStack_1190 - (long)puVar19)) {
              puStack_1190 = puVar31 + ((long)puStack_1190 - (long)puVar19);
            }
          }
          sVar4 = local_11b8._M_string_length;
          bVar32 = local_11b8._M_string_length != 0;
          if (local_11b8._M_string_length == 0) {
            local_1110 = (InternetProtocol *)CONCAT71((int7)((ulong)puVar20 >> 8),1);
          }
          else if (((ulong)local_10e0 & 1) == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_10a0,&local_11b8);
            lVar14 = std::__cxx11::string::find((char)&local_11b8,0x3a);
            if (lVar14 != -1) {
              std::__cxx11::string::substr((ulong)local_1168,(ulong)&local_11b8);
              std::__cxx11::string::substr((ulong)&local_1138,(ulong)&local_11b8);
              _Var3._M_p = local_1138._M_dataplus._M_p;
              _Var15 = std::
                       __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_1_>>
                                 (local_1138._M_dataplus._M_p,
                                  local_1138._M_dataplus._M_p + local_1138._M_string_length);
              uVar29 = (long)_Var3._M_p - (long)local_1138._M_dataplus._M_p;
              if (local_1138._M_dataplus._M_p + local_1138._M_string_length == _Var15._M_current) {
                local_1138._M_dataplus._M_p[uVar29] = '\0';
                local_1138._M_string_length = uVar29;
              }
              else {
                std::__cxx11::string::_M_erase((ulong)&local_1138,uVar29);
              }
              local_1108._M_dataplus._M_p =
                   local_1138._M_dataplus._M_p + local_1138._M_string_length;
              local_1070 = local_1138._M_dataplus._M_p;
              std::
              __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<http::Request::send(std::__cxx11::string_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(int)_2_>>
                        (&local_1098,&local_1108,&local_1070);
              uVar29 = (long)local_1098 - (long)local_1138._M_dataplus._M_p;
              *local_1098 = 0;
              local_1138._M_string_length = uVar29;
              iVar6 = std::__cxx11::string::compare(local_1168);
              _Var3._M_p = local_1138._M_dataplus._M_p;
              if (iVar6 == 0) {
                piVar13 = __errno_location();
                iVar6 = *piVar13;
                *piVar13 = 0;
                local_10d8 = strtoul(_Var3._M_p,(char **)&local_1108,10);
                if (local_1108._M_dataplus._M_p == _Var3._M_p) goto LAB_0015032b;
                iVar2 = *piVar13;
                if (iVar2 == 0) {
                  *piVar13 = iVar6;
                }
                else if (iVar2 == 0x22) {
                  std::__throw_out_of_range("stoul");
                  goto LAB_001503a6;
                }
                local_10c8 = CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1140,
                           local_10d8);
              }
              else {
                iVar6 = std::__cxx11::string::compare(local_1168);
                if (iVar6 == 0) {
                  iVar6 = std::__cxx11::string::compare((char *)&local_1138);
                  local_10d0 = CONCAT71((int7)(uVar29 >> 8),1);
                  if (iVar6 != 0) goto LAB_00150337;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
                operator_delete(local_1138._M_dataplus._M_p);
              }
              if ((pointer)local_1168._0_8_ != (pointer)(local_1168 + 0x10)) {
                operator_delete((void *)local_1168._0_8_);
              }
            }
          }
          else {
            local_1168._0_8_ = (pointer)0x0;
            local_1168._8_8_ = (pointer)0x0;
            local_1168._16_8_ = (pointer)0x0;
            uVar29 = local_11b8._M_string_length + 1;
            if (local_11b8._M_string_length != 0xffffffffffffffff) {
              uVar30 = 0;
              do {
                sVar12 = std::__cxx11::string::find((char)&local_11b8,0x20);
                if (sVar12 == 0xffffffffffffffff) {
                  sVar12 = sVar4;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(sVar12 - uVar30) !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  local_1138._M_dataplus._M_p = local_11b8._M_dataplus._M_p + uVar30;
                  local_1108._M_dataplus._M_p = (pointer)(sVar12 - uVar30);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*,unsigned_long>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_1168,(char **)&local_1138,(unsigned_long *)&local_1108);
                }
                uVar30 = sVar12 + 1;
              } while (uVar30 < uVar29);
            }
            if (0x20 < (ulong)(local_1168._8_8_ - local_1168._0_8_)) {
              __nptr = (((pointer)(local_1168._0_8_ + 0x20))->_M_dataplus)._M_p;
              piVar13 = __errno_location();
              iVar6 = *piVar13;
              *piVar13 = 0;
              lVar14 = strtol(__nptr,(char **)&local_1138,10);
              if (local_1138._M_dataplus._M_p == __nptr) {
                std::__throw_invalid_argument("stoi");
              }
              else if (((int)lVar14 == lVar14) && (*piVar13 != 0x22)) {
                if (*piVar13 == 0) {
                  *piVar13 = iVar6;
                }
                *(int *)local_1178 = (int)lVar14;
                goto LAB_0014fd85;
              }
              std::__throw_out_of_range("stoi");
LAB_0015032b:
              std::__throw_invalid_argument("stoul");
LAB_00150337:
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_1108,"Unsupported transfer encoding: ",&local_1138);
              std::runtime_error::runtime_error(this_00,(string *)&local_1108);
              *(undefined ***)this_00 = &PTR__runtime_error_001829a0;
              __cxa_throw(this_00,&ResponseError::typeinfo,std::runtime_error::~runtime_error);
            }
LAB_0014fd85:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1168);
            local_10e0 = (long *)((ulong)local_10e0 & 0xffffffff00000000);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
            operator_delete(local_11b8._M_dataplus._M_p);
          }
        }
      } while (bVar32);
    }
    if (((ulong)local_1110 & 1) == 0) {
LAB_0015029b:
      iVar6 = 0;
    }
    else if ((local_10d0 & 1) == 0) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1140,
                 (local_1178->domain)._M_dataplus._M_p,local_1198);
      if (puStack_1190 != local_1198) {
        puStack_1190 = local_1198;
      }
      if (((local_10c8 & 1) == 0) ||
         (iVar6 = 6,
         (long)(local_1178->domain)._M_dataplus._M_p - *(size_type *)local_1140 < local_10d8))
      goto LAB_0015029b;
    }
    else {
      local_116c = 0;
      uVar29 = local_10e8;
      do {
        while (puVar20 = puStack_1190, puVar31 = local_1198, uVar29 == 0) {
          local_10e8 = uVar29;
          if (bVar27) {
            uVar30 = uVar29;
            if ((ulong)((long)puStack_1190 - (long)local_1198) < 2) goto LAB_00150287;
            puVar20 = local_1198 + 2;
            if ((long)puStack_1190 - (long)puVar20 != 0) {
              memmove(local_1198,puVar20,(long)puStack_1190 - (long)puVar20);
            }
            puVar31 = puVar31 + ((long)puStack_1190 - (long)puVar20);
            if (puStack_1190 != puVar31) {
              puStack_1190 = puVar31;
            }
            bVar27 = false;
            bVar28 = false;
          }
          _Var11 = std::
                   __search<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                             (local_1198,puStack_1190,&local_11ba,&local_11b8);
          if (_Var11._M_current == puStack_1190) {
            bVar32 = false;
          }
          else {
            local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((string *)&local_11b8,local_1198,_Var11._M_current);
            puVar31 = local_1198;
            puVar20 = _Var11._M_current + 2;
            if (puVar20 != local_1198) {
              if ((long)puStack_1190 - (long)puVar20 != 0) {
                memmove(local_1198,puVar20,(long)puStack_1190 - (long)puVar20);
              }
              if (puStack_1190 != puVar31 + ((long)puStack_1190 - (long)puVar20)) {
                puStack_1190 = puVar31 + ((long)puStack_1190 - (long)puVar20);
              }
            }
            _Var3._M_p = local_11b8._M_dataplus._M_p;
            piVar13 = __errno_location();
            iVar6 = *piVar13;
            *piVar13 = 0;
            uVar29 = strtoul(_Var3._M_p,(char **)local_1168,0x10);
            if ((pointer)local_1168._0_8_ == _Var3._M_p) goto LAB_001503a6;
            if (*piVar13 == 0) {
              *piVar13 = iVar6;
            }
            else if (*piVar13 == 0x22) goto LAB_001503b2;
            bVar32 = uVar29 != 0;
            local_116c = local_116c & 0xff;
            if (!bVar32) {
              local_116c = 1;
            }
            local_10e8 = uVar29;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
              operator_delete(local_11b8._M_dataplus._M_p);
            }
          }
          uVar29 = local_10e8;
          uVar30 = local_10e8;
          if (!bVar32) goto LAB_00150287;
        }
        uVar26 = (long)puStack_1190 - (long)local_1198;
        uVar30 = uVar29;
        if (uVar26 < uVar29) {
          uVar30 = uVar26;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1140,
                   (local_1178->domain)._M_dataplus._M_p,local_1198,local_1198 + uVar30);
        puVar19 = local_1198;
        if (puVar20 != puVar31) {
          puVar31 = local_1198 + uVar30;
          if ((long)puStack_1190 - (long)puVar31 != 0) {
            memmove(local_1198,puVar31,(long)puStack_1190 - (long)puVar31);
          }
          if (puStack_1190 != puVar19 + ((long)puStack_1190 - (long)puVar31)) {
            puStack_1190 = puVar19 + ((long)puStack_1190 - (long)puVar31);
          }
        }
        uVar30 = uVar29 - uVar30;
        bVar27 = bVar28;
        if (uVar29 <= uVar26) {
          bVar27 = true;
        }
        uVar29 = uVar30;
        bVar28 = bVar27;
      } while (local_1198 != puStack_1190);
LAB_00150287:
      local_10e8 = uVar30;
      if ((local_116c & 1) == 0) goto LAB_0015029b;
      iVar6 = 6;
    }
LAB_0015029d:
    if (iVar6 != 0) {
      if (local_1198 != (uchar *)0x0) {
        operator_delete(local_1198);
      }
      detail::Socket::~Socket(&local_117c);
      if (local_1090 != (void *)0x0) {
        operator_delete(local_1090);
      }
      if ((long *)local_10c0._M_current != &local_10b0) {
        operator_delete(local_10c0._M_current);
      }
      if (local_1118 != (addrinfo *)0x0) {
        freeaddrinfo(local_1118);
      }
      return (ssize_t)local_1178;
    }
  } while( true );
LAB_001503a6:
  std::__throw_invalid_argument("stoul");
LAB_001503b2:
  std::__throw_out_of_range("stoul");
LAB_001503be:
  this_01 = (RequestError *)__cxa_allocate_exception(0x10);
  RequestError::RequestError(this_01,"Only HTTP scheme is supported");
  __cxa_throw(this_01,&RequestError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Response send(const std::string& method,
                      const std::vector<uint8_t>& body,
                      const std::vector<std::string>& headers)
        {
            if (scheme != "http")
                throw RequestError("Only HTTP scheme is supported");

            addrinfo hints = {};
            hints.ai_family = getAddressFamily(internetProtocol);
            hints.ai_socktype = SOCK_STREAM;

            addrinfo* info;
            if (getaddrinfo(domain.c_str(), port.c_str(), &hints, &info) != 0)
                throw std::system_error(getLastError(), std::system_category(), "Failed to get address info of " + domain);

            std::unique_ptr<addrinfo, decltype(&freeaddrinfo)> addressInfo(info, freeaddrinfo);

            std::string headerData = method + " " + path + " HTTP/1.1\r\n";

            for (const std::string& header : headers)
                headerData += header + "\r\n";

            headerData += "Host: " + domain + "\r\n"
                "Content-Length: " + std::to_string(body.size()) + "\r\n"
                "\r\n";

            std::vector<uint8_t> requestData(headerData.begin(), headerData.end());
            requestData.insert(requestData.end(), body.begin(), body.end());

            Socket socket(internetProtocol);

            // take the first address from the list
            socket.connect(addressInfo->ai_addr, static_cast<socklen_t>(addressInfo->ai_addrlen));

            auto remaining = requestData.size();
            auto sendData = requestData.data();

            // send the request
            while (remaining > 0)
            {
                const auto size = socket.send(sendData, remaining, noSignal);
                remaining -= size;
                sendData += size;
            }

            std::uint8_t tempBuffer[4096];
            constexpr std::uint8_t crlf[] = {'\r', '\n'};
            Response response;
            std::vector<std::uint8_t> responseData;
            bool firstLine = true;
            bool parsedHeaders = false;
            bool contentLengthReceived = false;
            unsigned long contentLength = 0;
            bool chunkedResponse = false;
            std::size_t expectedChunkSize = 0;
            bool removeCrlfAfterChunk = false;

            // read the response
            for (;;)
            {
                const auto size = socket.recv(tempBuffer, sizeof(tempBuffer), noSignal);

                if (size == 0)
                    break; // disconnected

                responseData.insert(responseData.end(), tempBuffer, tempBuffer + size);

                if (!parsedHeaders)
                    for (;;)
                    {
                        const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                        // didn't find a newline
                        if (i == responseData.end()) break;

                        const std::string line(responseData.begin(), i);
                        responseData.erase(responseData.begin(), i + 2);

                        // empty line indicates the end of the header section
                        if (line.empty())
                        {
                            parsedHeaders = true;
                            break;
                        }
                        else if (firstLine) // first line
                        {
                            firstLine = false;

                            std::string::size_type lastPos = 0;
                            const auto length = line.length();
                            std::vector<std::string> parts;

                            // tokenize first line
                            while (lastPos < length + 1)
                            {
                                auto pos = line.find(' ', lastPos);
                                if (pos == std::string::npos) pos = length;

                                if (pos != lastPos)
                                    parts.emplace_back(line.data() + lastPos,
                                                       static_cast<std::vector<std::string>::size_type>(pos) - lastPos);

                                lastPos = pos + 1;
                            }

                            if (parts.size() >= 2)
                                response.status = std::stoi(parts[1]);
                        }
                        else // headers
                        {
                            response.headers.push_back(line);

                            const auto pos = line.find(':');

                            if (pos != std::string::npos)
                            {
                                std::string headerName = line.substr(0, pos);
                                std::string headerValue = line.substr(pos + 1);

                                // ltrim
                                headerValue.erase(headerValue.begin(),
                                                  std::find_if(headerValue.begin(), headerValue.end(),
                                                               [](int c) {return !std::isspace(c);}));

                                // rtrim
                                headerValue.erase(std::find_if(headerValue.rbegin(), headerValue.rend(),
                                                               [](int c) {return !std::isspace(c);}).base(),
                                                  headerValue.end());

                                if (headerName == "Content-Length")
                                {
                                    contentLength = std::stoul(headerValue);
                                    contentLengthReceived = true;
                                    response.body.reserve(contentLength);
                                }
                                else if (headerName == "Transfer-Encoding")
                                {
                                    if (headerValue == "chunked")
                                        chunkedResponse = true;
                                    else
                                        throw ResponseError("Unsupported transfer encoding: " + headerValue);
                                }
                            }
                        }
                    }

                if (parsedHeaders)
                {
                    // Content-Length must be ignored if Transfer-Encoding is received
                    if (chunkedResponse)
                    {
                        bool dataReceived = false;
                        for (;;)
                        {
                            if (expectedChunkSize > 0)
                            {
                                const auto toWrite = std::min(expectedChunkSize, responseData.size());
                                response.body.insert(response.body.end(), responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                responseData.erase(responseData.begin(), responseData.begin() + static_cast<ptrdiff_t>(toWrite));
                                expectedChunkSize -= toWrite;

                                if (expectedChunkSize == 0) removeCrlfAfterChunk = true;
                                if (responseData.empty()) break;
                            }
                            else
                            {
                                if (removeCrlfAfterChunk)
                                {
                                    if (responseData.size() >= 2)
                                    {
                                        removeCrlfAfterChunk = false;
                                        responseData.erase(responseData.begin(), responseData.begin() + 2);
                                    }
                                    else break;
                                }

                                const auto i = std::search(responseData.begin(), responseData.end(), std::begin(crlf), std::end(crlf));

                                if (i == responseData.end()) break;

                                const std::string line(responseData.begin(), i);
                                responseData.erase(responseData.begin(), i + 2);

                                expectedChunkSize = std::stoul(line, nullptr, 16);

                                if (expectedChunkSize == 0)
                                {
                                    dataReceived = true;
                                    break;
                                }
                            }
                        }

                        if (dataReceived)
                            break;
                    }
                    else
                    {
                        response.body.insert(response.body.end(), responseData.begin(), responseData.end());
                        responseData.clear();

                        // got the whole content
                        if (contentLengthReceived && response.body.size() >= contentLength)
                            break;
                    }
                }
            }

            return response;
        }